

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,offset_datetime_type x,
          offset_datetime_format_info fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  format_type f;
  value_type v;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  region *this_00;
  size_t in_R8;
  region *in_stack_00000008;
  
  *in_RDI = 5;
  v._8_8_ = in_RDX;
  v._0_8_ = in_RSI;
  f.subsecond_precision = in_R8;
  f._0_8_ = in_RCX;
  toml::detail::value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info>::
  value_with_format((value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info> *)
                    (in_RDI + 8),v,f);
  this_00 = (region *)(in_RDI + 0x48);
  toml::detail::region::region(this_00,in_stack_00000008);
  preserve_comments::preserve_comments
            ((preserve_comments *)this_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_00000008);
  return;
}

Assistant:

basic_value(offset_datetime_type x, offset_datetime_format_info fmt,
                std::vector<std::string> com, region_type reg)
        : type_(value_t::offset_datetime), offset_datetime_(offset_datetime_storage(x, fmt)),
          region_(std::move(reg)), comments_(std::move(com))
    {}